

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_decoder__on_seek_memory(ma_decoder *pDecoder,int byteOffset,ma_seek_origin origin)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  ma_vfs_file pvVar4;
  
  if (origin == ma_seek_origin_current) {
    uVar2 = (pDecoder->backend).memory.currentReadPos;
    if (byteOffset < 1) {
      if (uVar2 < (uint)-byteOffset) {
        byteOffset = -(int)uVar2;
      }
    }
    else {
      uVar3 = (pDecoder->backend).memory.dataSize;
      if (uVar3 < (uint)byteOffset + uVar2) {
        byteOffset = (int)uVar3 - (int)uVar2;
      }
    }
    psVar1 = &(pDecoder->backend).memory.currentReadPos;
    *psVar1 = *psVar1 + (long)byteOffset;
  }
  else {
    pvVar4 = (pDecoder->backend).vfs.file;
    if ((ma_vfs_file)(ulong)(uint)byteOffset <= pvVar4) {
      pvVar4 = (ma_vfs_file)(long)byteOffset;
    }
    (pDecoder->backend).memory.currentReadPos = (size_t)pvVar4;
  }
  return 1;
}

Assistant:

static ma_bool32 ma_decoder__on_seek_memory(ma_decoder* pDecoder, int byteOffset, ma_seek_origin origin)
{
    if (origin == ma_seek_origin_current) {
        if (byteOffset > 0) {
            if (pDecoder->backend.memory.currentReadPos + byteOffset > pDecoder->backend.memory.dataSize) {
                byteOffset = (int)(pDecoder->backend.memory.dataSize - pDecoder->backend.memory.currentReadPos);  /* Trying to seek too far forward. */
            }
        } else {
            if (pDecoder->backend.memory.currentReadPos < (size_t)-byteOffset) {
                byteOffset = -(int)pDecoder->backend.memory.currentReadPos;  /* Trying to seek too far backwards. */
            }
        }

        /* This will never underflow thanks to the clamps above. */
        pDecoder->backend.memory.currentReadPos += byteOffset;
    } else {
        if ((ma_uint32)byteOffset <= pDecoder->backend.memory.dataSize) {
            pDecoder->backend.memory.currentReadPos = byteOffset;
        } else {
            pDecoder->backend.memory.currentReadPos = pDecoder->backend.memory.dataSize;  /* Trying to seek too far forward. */
        }
    }

    return MA_TRUE;
}